

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O2

void av1_fwd_txfm2d_16x16_sse4_1(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  char cVar1;
  int8_t *piVar2;
  int iVar3;
  undefined7 in_register_00000009;
  int bit;
  int bit_00;
  int bit_01;
  int bit_02;
  int fliplr;
  int shift;
  __m128i out [64];
  __m128i in [64];
  
  piVar2 = av1_fwd_txfm_shift_ls[2];
  if (0xf < (uint)CONCAT71(in_register_00000009,tx_type)) {
    return;
  }
  switch(CONCAT71(in_register_00000009,tx_type) & 0xffffffff) {
  case 0:
    load_buffer_16x16(input,in,stride,0,0,(int)*av1_fwd_txfm_shift_ls[2]);
    fdct16x16_sse4_1(in,out,0xd,4);
    break;
  case 1:
    cVar1 = *av1_fwd_txfm_shift_ls[2];
    iVar3 = 0;
    goto LAB_009b7d43;
  case 2:
    cVar1 = *av1_fwd_txfm_shift_ls[2];
    iVar3 = 0;
    goto LAB_009b7db7;
  case 3:
    cVar1 = *av1_fwd_txfm_shift_ls[2];
    iVar3 = 0;
    goto LAB_009b7e9e;
  case 4:
    cVar1 = *av1_fwd_txfm_shift_ls[2];
    iVar3 = 1;
LAB_009b7d43:
    load_buffer_16x16(input,in,stride,iVar3,0,(int)cVar1);
    fadst16x16_sse4_1(in,out,0xd,4);
    break;
  case 5:
    cVar1 = *av1_fwd_txfm_shift_ls[2];
    iVar3 = 1;
LAB_009b7db7:
    load_buffer_16x16(input,in,stride,0,iVar3,(int)cVar1);
    fdct16x16_sse4_1(in,out,0xd,4);
    goto LAB_009b7ec4;
  case 6:
    shift = (int)*av1_fwd_txfm_shift_ls[2];
    iVar3 = 1;
    fliplr = iVar3;
    goto LAB_009b7ea1;
  case 7:
    shift = (int)*av1_fwd_txfm_shift_ls[2];
    iVar3 = 0;
    fliplr = 1;
    goto LAB_009b7ea1;
  case 8:
    cVar1 = *av1_fwd_txfm_shift_ls[2];
    iVar3 = 1;
LAB_009b7e9e:
    shift = (int)cVar1;
    fliplr = 0;
LAB_009b7ea1:
    load_buffer_16x16(input,in,stride,iVar3,fliplr,shift);
    fadst16x16_sse4_1(in,out,0xd,4);
LAB_009b7ec4:
    col_txfm_16x16_rounding(out,-(int)piVar2[1]);
    transpose_16x16(out,in);
    fadst16x16_sse4_1(in,out,0xc,4);
    goto LAB_009b7ef7;
  case 9:
    load_buffer_16x16(input,in,stride,0,0,(int)*av1_fwd_txfm_shift_ls[2]);
    idtx16x16_sse4_1(in,out,bit_00,4);
    goto LAB_009b7e61;
  case 10:
    load_buffer_16x16(input,in,stride,0,0,(int)*av1_fwd_txfm_shift_ls[2]);
    fdct16x16_sse4_1(in,out,0xd,4);
    goto LAB_009b7e61;
  case 0xb:
    load_buffer_16x16(input,in,stride,0,0,(int)*av1_fwd_txfm_shift_ls[2]);
    idtx16x16_sse4_1(in,out,bit,4);
    break;
  case 0xc:
    cVar1 = *av1_fwd_txfm_shift_ls[2];
    iVar3 = 0;
    goto LAB_009b7c6d;
  case 0xd:
    cVar1 = *av1_fwd_txfm_shift_ls[2];
    iVar3 = 0;
    goto LAB_009b7df4;
  case 0xe:
    cVar1 = *av1_fwd_txfm_shift_ls[2];
    iVar3 = 1;
LAB_009b7c6d:
    load_buffer_16x16(input,in,stride,iVar3,0,(int)cVar1);
    fadst16x16_sse4_1(in,out,0xd,4);
LAB_009b7e61:
    col_txfm_16x16_rounding(out,-(int)piVar2[1]);
    transpose_16x16(out,in);
    idtx16x16_sse4_1(in,out,bit_02,4);
    goto LAB_009b7ef7;
  case 0xf:
    cVar1 = *av1_fwd_txfm_shift_ls[2];
    iVar3 = 1;
LAB_009b7df4:
    load_buffer_16x16(input,in,stride,0,iVar3,(int)cVar1);
    idtx16x16_sse4_1(in,out,bit_01,4);
    goto LAB_009b7ec4;
  }
  col_txfm_16x16_rounding(out,-(int)piVar2[1]);
  transpose_16x16(out,in);
  fdct16x16_sse4_1(in,out,0xc,4);
LAB_009b7ef7:
  write_buffer_16x16(out,coeff);
  return;
}

Assistant:

void av1_fwd_txfm2d_16x16_sse4_1(const int16_t *input, int32_t *coeff,
                                 int stride, TX_TYPE tx_type, int bd) {
  __m128i in[64], out[64];
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_16X16];
  const int txw_idx = get_txw_idx(TX_16X16);
  const int txh_idx = get_txh_idx(TX_16X16);
  const int col_num = 4;
  switch (tx_type) {
    case DCT_DCT:
      load_buffer_16x16(input, in, stride, 0, 0, shift[0]);
      fdct16x16_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], col_num);
      col_txfm_16x16_rounding(out, -shift[1]);
      transpose_16x16(out, in);
      fdct16x16_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], col_num);
      write_buffer_16x16(out, coeff);
      break;
    case ADST_DCT:
      load_buffer_16x16(input, in, stride, 0, 0, shift[0]);
      fadst16x16_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx],
                        col_num);
      col_txfm_16x16_rounding(out, -shift[1]);
      transpose_16x16(out, in);
      fdct16x16_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], col_num);
      write_buffer_16x16(out, coeff);
      break;
    case DCT_ADST:
      load_buffer_16x16(input, in, stride, 0, 0, shift[0]);
      fdct16x16_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], col_num);
      col_txfm_16x16_rounding(out, -shift[1]);
      transpose_16x16(out, in);
      fadst16x16_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx],
                        col_num);
      write_buffer_16x16(out, coeff);
      break;
    case ADST_ADST:
      load_buffer_16x16(input, in, stride, 0, 0, shift[0]);
      fadst16x16_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx],
                        col_num);
      col_txfm_16x16_rounding(out, -shift[1]);
      transpose_16x16(out, in);
      fadst16x16_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx],
                        col_num);
      write_buffer_16x16(out, coeff);
      break;
    case FLIPADST_DCT:
      load_buffer_16x16(input, in, stride, 1, 0, shift[0]);
      fadst16x16_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx],
                        col_num);
      col_txfm_16x16_rounding(out, -shift[1]);
      transpose_16x16(out, in);
      fdct16x16_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], col_num);
      write_buffer_16x16(out, coeff);
      break;
    case DCT_FLIPADST:
      load_buffer_16x16(input, in, stride, 0, 1, shift[0]);
      fdct16x16_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], col_num);
      col_txfm_16x16_rounding(out, -shift[1]);
      transpose_16x16(out, in);
      fadst16x16_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx],
                        col_num);
      write_buffer_16x16(out, coeff);
      break;
    case FLIPADST_FLIPADST:
      load_buffer_16x16(input, in, stride, 1, 1, shift[0]);
      fadst16x16_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx],
                        col_num);
      col_txfm_16x16_rounding(out, -shift[1]);
      transpose_16x16(out, in);
      fadst16x16_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx],
                        col_num);
      write_buffer_16x16(out, coeff);
      break;
    case ADST_FLIPADST:
      load_buffer_16x16(input, in, stride, 0, 1, shift[0]);
      fadst16x16_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx],
                        col_num);
      col_txfm_16x16_rounding(out, -shift[1]);
      transpose_16x16(out, in);
      fadst16x16_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx],
                        col_num);
      write_buffer_16x16(out, coeff);
      break;
    case FLIPADST_ADST:
      load_buffer_16x16(input, in, stride, 1, 0, shift[0]);
      fadst16x16_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx],
                        col_num);
      col_txfm_16x16_rounding(out, -shift[1]);
      transpose_16x16(out, in);
      fadst16x16_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx],
                        col_num);
      write_buffer_16x16(out, coeff);
      break;
    case IDTX:
      load_buffer_16x16(input, in, stride, 0, 0, shift[0]);
      idtx16x16_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], col_num);
      col_txfm_16x16_rounding(out, -shift[1]);
      transpose_16x16(out, in);
      idtx16x16_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], col_num);
      write_buffer_16x16(out, coeff);
      break;
    case V_DCT:
      load_buffer_16x16(input, in, stride, 0, 0, shift[0]);
      fdct16x16_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], col_num);
      col_txfm_16x16_rounding(out, -shift[1]);
      transpose_16x16(out, in);
      idtx16x16_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], col_num);
      write_buffer_16x16(out, coeff);
      break;
    case H_DCT:
      load_buffer_16x16(input, in, stride, 0, 0, shift[0]);
      idtx16x16_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], col_num);
      col_txfm_16x16_rounding(out, -shift[1]);
      transpose_16x16(out, in);
      fdct16x16_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], col_num);
      write_buffer_16x16(out, coeff);
      break;
    case V_ADST:
      load_buffer_16x16(input, in, stride, 0, 0, shift[0]);
      fadst16x16_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx],
                        col_num);
      col_txfm_16x16_rounding(out, -shift[1]);
      transpose_16x16(out, in);
      idtx16x16_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], col_num);
      write_buffer_16x16(out, coeff);
      break;
    case H_ADST:
      load_buffer_16x16(input, in, stride, 0, 0, shift[0]);
      idtx16x16_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], col_num);
      col_txfm_16x16_rounding(out, -shift[1]);
      transpose_16x16(out, in);
      fadst16x16_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx],
                        col_num);
      write_buffer_16x16(out, coeff);
      break;
    case V_FLIPADST:
      load_buffer_16x16(input, in, stride, 1, 0, shift[0]);
      fadst16x16_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx],
                        col_num);
      col_txfm_16x16_rounding(out, -shift[1]);
      transpose_16x16(out, in);
      idtx16x16_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], col_num);
      write_buffer_16x16(out, coeff);
      break;
    case H_FLIPADST:
      load_buffer_16x16(input, in, stride, 0, 1, shift[0]);
      idtx16x16_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], col_num);
      col_txfm_16x16_rounding(out, -shift[1]);
      transpose_16x16(out, in);
      fadst16x16_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx],
                        col_num);
      write_buffer_16x16(out, coeff);
      break;
    default: assert(0);
  }
  (void)bd;
}